

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

int __thiscall efsw::String::compare(String *this,char *s)

{
  int iVar1;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_30;
  
  String((String *)&local_30,s);
  iVar1 = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::compare
                    (&this->mString,&local_30);
  std::__cxx11::u32string::~u32string((u32string *)&local_30);
  return iVar1;
}

Assistant:

int String::compare( const char* s ) const {
	return compare( String( s ) );
}